

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,Expression *curr)

{
  Type TVar1;
  char cVar2;
  uint uVar3;
  _Node_iterator_base<wasm::Name,_true> _Var4;
  Flow *extraout_RAX;
  Type TVar5;
  ostream *poVar6;
  uint uVar7;
  Const *curr_00;
  Const *extraout_RDX;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar12;
  __node_gen_type __node_gen;
  
  uVar3 = this->maxDepth;
  uVar7 = this->depth + 1;
  this->depth = uVar7;
  curr_00 = (Const *)CONCAT71((int7)((ulong)curr >> 8),uVar3 != 0);
  if (uVar3 < uVar7 && uVar3 != 0) {
    (*this->_vptr_ExpressionRunner[3])(this,"interpreter recursion limit");
    curr_00 = extraout_RDX;
  }
  uVar11 = uRam0000000000177fec;
  uVar10 = _extendLowUToI32x4;
  uVar9 = NONCONSTANT_FLOW._4_4_;
  uVar8 = (undefined4)NONCONSTANT_FLOW;
  if (curr == (Expression *)0x0) {
    __assert_fail("curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x3b,
                  "ReturnType wasm::Visitor<(anonymous namespace)::EvallingModuleRunner, wasm::Flow>::visit(Expression *) [SubType = (anonymous namespace)::EvallingModuleRunner, ReturnType = wasm::Flow]"
                 );
  }
  uVar3 = curr->_id - 1;
  if (0x5e < uVar3) {
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
               ,0x46);
  }
  _Var4._M_cur = (__node_type *)
                 ((long)&switchD_0012aaf7::switchdataD_0015e0d8 +
                 (long)(int)(&switchD_0012aaf7::switchdataD_0015e0d8)[uVar3]);
  switch((uint)curr->_id) {
  case 1:
    _Var4._M_cur = (__node_type *)visitBlock(__return_storage_ptr__,this,(Block *)curr);
    break;
  case 2:
    _Var4._M_cur = (__node_type *)visitIf(__return_storage_ptr__,this,(If *)curr);
    break;
  case 3:
    _Var4._M_cur = (__node_type *)visitLoop(__return_storage_ptr__,this,(Loop *)curr);
    break;
  case 4:
    _Var4._M_cur = (__node_type *)visitBreak(__return_storage_ptr__,this,(Break *)curr);
    break;
  case 5:
    _Var4._M_cur = (__node_type *)visitSwitch(__return_storage_ptr__,this,(Switch *)curr);
    break;
  case 6:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitCall
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (Call *)curr);
    break;
  case 7:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitCallIndirect
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (CallIndirect *)curr);
    break;
  case 8:
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,
               (SmallVector<wasm::Literal,_1UL> *)
               ((ulong)*(uint *)(curr + 1) * 0x38 + **(long **)&this[9].maxLoopIterations));
    uVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
    _Var4._M_cur = (__node_type *)extraout_RAX;
    goto LAB_0012ab1c;
  case 9:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitLocalSet
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (LocalSet *)curr);
    break;
  case 10:
    _Var4._M_cur = (__node_type *)
                   anon_unknown.dwarf_5f52c::EvallingModuleRunner::visitGlobalGet
                             (__return_storage_ptr__,(EvallingModuleRunner *)this,(GlobalGet *)curr)
    ;
    break;
  case 0xb:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitGlobalSet
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (GlobalSet *)curr);
    break;
  case 0xc:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitLoad
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (Load *)curr);
    break;
  case 0xd:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitStore
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (Store *)curr);
    break;
  case 0xe:
    _Var4._M_cur = (__node_type *)
                   visitConst(__return_storage_ptr__,
                              (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)curr,
                              curr_00);
    break;
  case 0xf:
    _Var4._M_cur = (__node_type *)visitUnary(__return_storage_ptr__,this,(Unary *)curr);
    break;
  case 0x10:
    _Var4._M_cur = (__node_type *)visitBinary(__return_storage_ptr__,this,(Binary *)curr);
    break;
  case 0x11:
    _Var4._M_cur = (__node_type *)visitSelect(__return_storage_ptr__,this,(Select *)curr);
    break;
  case 0x12:
    _Var4._M_cur = (__node_type *)visitDrop(__return_storage_ptr__,this,(Drop *)curr);
    break;
  case 0x13:
    _Var4._M_cur = (__node_type *)visitReturn(__return_storage_ptr__,this,(Return *)curr);
    break;
  case 0x14:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitMemorySize
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              *(MemorySize **)(curr + 1));
    break;
  case 0x15:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitMemoryGrow
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (MemoryGrow *)curr);
    break;
  case 0x18:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitAtomicRMW
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (AtomicRMW *)curr);
    break;
  case 0x19:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitAtomicCmpxchg
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (AtomicCmpxchg *)curr);
    break;
  case 0x1a:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitAtomicWait
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (AtomicWait *)curr);
    break;
  case 0x1b:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitAtomicNotify
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (AtomicNotify *)curr);
    break;
  case 0x1d:
    _Var4._M_cur = (__node_type *)visitSIMDExtract(__return_storage_ptr__,this,(SIMDExtract *)curr);
    break;
  case 0x1e:
    _Var4._M_cur = (__node_type *)visitSIMDReplace(__return_storage_ptr__,this,(SIMDReplace *)curr);
    break;
  case 0x1f:
    _Var4._M_cur = (__node_type *)visitSIMDShuffle(__return_storage_ptr__,this,(SIMDShuffle *)curr);
    break;
  case 0x20:
    _Var4._M_cur = (__node_type *)visitSIMDTernary(__return_storage_ptr__,this,(SIMDTernary *)curr);
    break;
  case 0x21:
    _Var4._M_cur = (__node_type *)visitSIMDShift(__return_storage_ptr__,this,(SIMDShift *)curr);
    break;
  case 0x22:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitSIMDLoad
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (SIMDLoad *)curr);
    break;
  case 0x23:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::
                   visitSIMDLoadStoreLane
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (SIMDLoadStoreLane *)curr);
    break;
  case 0x24:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitMemoryInit
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (MemoryInit *)curr);
    break;
  case 0x25:
    pVar12 = std::
             _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
             ::
             _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                       ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                         *)&this[4].maxDepth,curr + 1);
    _Var4._M_cur = (__node_type *)pVar12.first.super__Node_iterator_base<wasm::Name,_true>._M_cur;
  case 0x16:
  case 0x1c:
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .func.super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
    break;
  case 0x26:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitMemoryCopy
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (MemoryCopy *)curr);
    break;
  case 0x27:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitMemoryFill
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (MemoryFill *)curr);
    break;
  case 0x28:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitPop
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (Pop *)curr);
    break;
  case 0x29:
    _Var4._M_cur = (__node_type *)
                   visitRefNull(__return_storage_ptr__,
                                (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                                curr,(RefNull *)curr_00);
    break;
  case 0x2a:
    _Var4._M_cur = (__node_type *)visitRefIsNull(__return_storage_ptr__,this,(RefIsNull *)curr);
    break;
  case 0x2b:
    _Var4._M_cur = (__node_type *)
                   visitRefFunc(__return_storage_ptr__,
                                (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                                curr,(RefFunc *)curr_00);
    break;
  case 0x2c:
    _Var4._M_cur = (__node_type *)visitRefEq(__return_storage_ptr__,this,(RefEq *)curr);
    break;
  case 0x2d:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTableGet
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (TableGet *)curr);
    break;
  case 0x2e:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTableSet
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (TableSet *)curr);
    break;
  case 0x2f:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTableSize
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (TableSize *)curr);
    break;
  case 0x30:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTableGrow
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (TableGrow *)curr);
    break;
  case 0x31:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTableFill
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (TableFill *)curr);
    break;
  case 0x32:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTableCopy
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (TableCopy *)curr);
    break;
  case 0x33:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTableInit
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (TableInit *)curr);
    break;
  case 0x34:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTry
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (Try *)curr);
    break;
  case 0x35:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTryTable
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (TryTable *)curr);
    break;
  case 0x36:
    _Var4._M_cur = (__node_type *)visitThrow(__return_storage_ptr__,this,(Throw *)curr);
    break;
  case 0x37:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitRethrow
              ((Flow *)this,(ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)curr,
               (Rethrow *)curr_00);
  case 0x17:
    (*this->_vptr_ExpressionRunner[2])(this,"unreachable");
    wasm::handle_unreachable
              ("unreachable",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0x57a);
  case 0x38:
    _Var4._M_cur = (__node_type *)visitThrowRef(__return_storage_ptr__,this,(ThrowRef *)curr);
    break;
  case 0x39:
    _Var4._M_cur = (__node_type *)visitTupleMake(__return_storage_ptr__,this,(TupleMake *)curr);
    break;
  case 0x3a:
    _Var4._M_cur = (__node_type *)
                   visitTupleExtract(__return_storage_ptr__,this,(TupleExtract *)curr);
    break;
  case 0x3b:
    _Var4._M_cur = (__node_type *)visitRefI31(__return_storage_ptr__,this,(RefI31 *)curr);
    break;
  case 0x3c:
    _Var4._M_cur = (__node_type *)visitI31Get(__return_storage_ptr__,this,(I31Get *)curr);
    break;
  case 0x3d:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitCallRef
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (CallRef *)curr);
    break;
  case 0x3e:
    _Var4._M_cur = (__node_type *)visitRefTest(__return_storage_ptr__,this,(RefTest *)curr);
    break;
  case 0x3f:
    _Var4._M_cur = (__node_type *)visitRefCast(__return_storage_ptr__,this,(RefCast *)curr);
    break;
  case 0x40:
    _Var4._M_cur = (__node_type *)visitBrOn(__return_storage_ptr__,this,(BrOn *)curr);
    break;
  case 0x41:
    _Var4._M_cur = (__node_type *)visitStructNew(__return_storage_ptr__,this,(StructNew *)curr);
    break;
  case 0x42:
    _Var4._M_cur = (__node_type *)visitStructGet(__return_storage_ptr__,this,(StructGet *)curr);
    break;
  case 0x43:
    _Var4._M_cur = (__node_type *)visitStructSet(__return_storage_ptr__,this,(StructSet *)curr);
    break;
  case 0x44:
    _Var4._M_cur = (__node_type *)visitStructRMW(__return_storage_ptr__,this,(StructRMW *)curr);
    break;
  case 0x45:
    _Var4._M_cur = (__node_type *)
                   visitStructCmpxchg(__return_storage_ptr__,this,(StructCmpxchg *)curr);
    break;
  case 0x46:
    _Var4._M_cur = (__node_type *)visitArrayNew(__return_storage_ptr__,this,(ArrayNew *)curr);
    break;
  case 0x47:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitArrayNewData
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (ArrayNewData *)curr);
    break;
  case 0x48:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitArrayNewElem
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (ArrayNewElem *)curr);
    break;
  case 0x49:
    _Var4._M_cur = (__node_type *)
                   visitArrayNewFixed(__return_storage_ptr__,this,(ArrayNewFixed *)curr);
    break;
  case 0x4a:
    _Var4._M_cur = (__node_type *)visitArrayGet(__return_storage_ptr__,this,(ArrayGet *)curr);
    break;
  case 0x4b:
    _Var4._M_cur = (__node_type *)visitArraySet(__return_storage_ptr__,this,(ArraySet *)curr);
    break;
  case 0x4c:
    _Var4._M_cur = (__node_type *)visitArrayLen(__return_storage_ptr__,this,(ArrayLen *)curr);
    break;
  case 0x4d:
    _Var4._M_cur = (__node_type *)visitArrayCopy(__return_storage_ptr__,this,(ArrayCopy *)curr);
    break;
  case 0x4e:
    _Var4._M_cur = (__node_type *)visitArrayFill(__return_storage_ptr__,this,(ArrayFill *)curr);
    break;
  case 0x4f:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitArrayInitData
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (ArrayInitData *)curr);
    break;
  case 0x50:
    _Var4._M_cur = (__node_type *)
                   ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitArrayInitElem
                             (__return_storage_ptr__,
                              (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                              (ArrayInitElem *)curr);
    break;
  case 0x51:
    _Var4._M_cur = (__node_type *)visitRefAs(__return_storage_ptr__,this,(RefAs *)curr);
    break;
  case 0x52:
    _Var4._M_cur = (__node_type *)visitStringNew(__return_storage_ptr__,this,(StringNew *)curr);
    break;
  case 0x53:
    _Var4._M_cur = (__node_type *)
                   visitStringConst(__return_storage_ptr__,
                                    *(ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>
                                      **)(curr + 1),(StringConst *)curr[1].type.id);
    break;
  case 0x54:
    _Var4._M_cur = (__node_type *)
                   visitStringMeasure(__return_storage_ptr__,this,(StringMeasure *)curr);
    break;
  case 0x55:
    _Var4._M_cur = (__node_type *)
                   visitStringEncode(__return_storage_ptr__,this,(StringEncode *)curr);
    break;
  case 0x56:
    _Var4._M_cur = (__node_type *)
                   visitStringConcat(__return_storage_ptr__,this,(StringConcat *)curr);
    break;
  case 0x57:
    _Var4._M_cur = (__node_type *)visitStringEq(__return_storage_ptr__,this,(StringEq *)curr);
    break;
  case 0x58:
    _Var4._M_cur = (__node_type *)
                   visitStringWTF16Get(__return_storage_ptr__,this,(StringWTF16Get *)curr);
    break;
  case 0x59:
    _Var4._M_cur = (__node_type *)
                   visitStringSliceWTF(__return_storage_ptr__,this,(StringSliceWTF *)curr);
    break;
  default:
    _Var4._M_cur = (__node_type *)&NONCONSTANT_FLOW;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .func.super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0012ab1c:
    *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_len = uVar8;
    *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_len + 4) = uVar9;
    *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_str = uVar10;
    *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_str + 4) = uVar11;
  }
  if ((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) {
    TVar5 = Literals::getType(&__return_storage_ptr__->values);
    _Var4._M_cur = (__node_type *)CONCAT71((int7)(TVar5.id >> 8),1 < TVar5.id);
    TVar1.id = (curr->type).id;
    if (1 < TVar1.id || 1 < TVar5.id) {
      cVar2 = wasm::Type::isSubType(TVar5,TVar1);
      if (cVar2 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"expected ",9);
        poVar6 = (ostream *)std::operator<<(&std::cerr,this->module,(curr->type).id);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", seeing ",9);
        poVar6 = (ostream *)std::operator<<(poVar6,this->module,TVar5.id);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," from\n",6);
        poVar6 = (ostream *)std::operator<<(poVar6,this->module,curr);
        __node_gen._M_h._7_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(char *)((long)&__node_gen._M_h + 7),1);
      }
      _Var4._M_cur = (__node_type *)wasm::Type::isSubType(TVar5,(Type)(curr->type).id);
      if ((char)_Var4._M_cur == '\0') {
        __assert_fail("Type::isSubType(type, curr->type)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x10b,
                      "Flow wasm::ExpressionRunner<(anonymous namespace)::EvallingModuleRunner>::visit(Expression *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                     );
      }
    }
  }
  this->depth = this->depth - 1;
  return (Flow *)_Var4._M_cur;
}

Assistant:

Flow visit(Expression* curr) {
    depth++;
    if (maxDepth != NO_LIMIT && depth > maxDepth) {
      hostLimit("interpreter recursion limit");
    }
    auto ret = OverriddenVisitor<SubType, Flow>::visit(curr);
    if (!ret.breaking()) {
      Type type = ret.getType();
      if (type.isConcrete() || curr->type.isConcrete()) {
#if 1 // def WASM_INTERPRETER_DEBUG
        if (!Type::isSubType(type, curr->type)) {
          std::cerr << "expected " << ModuleType(*module, curr->type)
                    << ", seeing " << ModuleType(*module, type) << " from\n"
                    << ModuleExpression(*module, curr) << '\n';
        }
#endif
        assert(Type::isSubType(type, curr->type));
      }
    }
    depth--;
    return ret;
  }